

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

WaitForkStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::WaitForkStatementSyntax,slang::syntax::WaitForkStatementSyntax_const&>
          (BumpAllocator *this,WaitForkStatementSyntax *args)

{
  WaitForkStatementSyntax *pWVar1;
  WaitForkStatementSyntax *in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  pWVar1 = (WaitForkStatementSyntax *)allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  slang::syntax::WaitForkStatementSyntax::WaitForkStatementSyntax(in_RSI,pWVar1);
  return pWVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }